

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

double Gudhi::Persistence_representations::compute_maximal_distance_non_symmetric
                 (Persistence_landscape *pl1,Persistence_landscape *pl2)

{
  pair<double,_double> p1;
  pair<double,_double> p2;
  pair<double,_double> p1_00;
  pair<double,_double> p2_00;
  unsigned_long uVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  ostream *poVar4;
  void *pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  double dVar9;
  double dVar10;
  size_type local_c0;
  size_t i_3;
  size_t level_1;
  double val;
  size_t i_2;
  size_type sStack_58;
  int p2Count;
  size_t i_1;
  size_t i;
  size_t level;
  size_type local_38;
  unsigned_long local_30;
  size_t minimalNumberOfLevels;
  double maxDist;
  Persistence_landscape *pPStack_18;
  bool dbg;
  Persistence_landscape *pl2_local;
  Persistence_landscape *pl1_local;
  
  maxDist._7_1_ = 0;
  minimalNumberOfLevels = 0;
  pPStack_18 = pl2;
  pl2_local = pl1;
  local_38 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::size(&pl1->land);
  level = std::
          vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
          ::size(&pPStack_18->land);
  puVar3 = std::min<unsigned_long>(&local_38,&level);
  local_30 = *puVar3;
  i = 0;
  do {
    if (i == local_30) {
      if ((maxDist._7_1_ & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::clog,"minimalNumberOfLevels : ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_30);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      uVar1 = local_30;
      sVar7 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::size(&pl2_local->land);
      if (uVar1 < sVar7) {
        for (i_3 = local_30;
            sVar7 = std::
                    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ::size(&pl2_local->land), i_3 != sVar7; i_3 = i_3 + 1) {
          local_c0 = 0;
          while( true ) {
            pvVar6 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&pl2_local->land,i_3);
            sVar7 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    size(pvVar6);
            if (local_c0 == sVar7) break;
            if ((maxDist._7_1_ & 1) != 0) {
              poVar4 = std::operator<<((ostream *)&std::clog,"pl1[level][i].second  : ");
              pvVar6 = std::
                       vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                       ::operator[](&pl2_local->land,i_3);
              pvVar8 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[](pvVar6,local_c0);
              pvVar5 = (void *)std::ostream::operator<<(poVar4,pvVar8->second);
              std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
            }
            sVar2 = minimalNumberOfLevels;
            pvVar6 = std::
                     vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ::operator[](&pl2_local->land,i_3);
            pvVar8 = std::
                     vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ::operator[](pvVar6,local_c0);
            if ((double)sVar2 < pvVar8->second) {
              pvVar6 = std::
                       vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                       ::operator[](&pl2_local->land,i_3);
              pvVar8 = std::
                       vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ::operator[](pvVar6,local_c0);
              minimalNumberOfLevels = (size_t)pvVar8->second;
            }
            local_c0 = local_c0 + 1;
          }
        }
      }
      return (double)minimalNumberOfLevels;
    }
    if ((maxDist._7_1_ & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::clog,"Level : ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,i);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::clog,"PL1 : \n");
      i_1 = 0;
      while( true ) {
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pl2_local->land,i);
        sVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar6);
        if (i_1 == sVar7) break;
        poVar4 = std::operator<<((ostream *)&std::clog,"(");
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pl2_local->land,i);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,i_1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
        poVar4 = std::operator<<(poVar4,",");
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pl2_local->land,i);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,i_1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->second);
        std::operator<<(poVar4,") \n");
        i_1 = i_1 + 1;
      }
      std::operator<<((ostream *)&std::clog,"PL2 : \n");
      sStack_58 = 0;
      while( true ) {
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pPStack_18->land,i);
        sVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(pvVar6);
        if (sStack_58 == sVar7) break;
        poVar4 = std::operator<<((ostream *)&std::clog,"(");
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pPStack_18->land,i);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,sStack_58);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
        poVar4 = std::operator<<(poVar4,",");
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pPStack_18->land,i);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,sStack_58);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->second);
        std::operator<<(poVar4,") \n");
        sStack_58 = sStack_58 + 1;
      }
      std::istream::ignore();
    }
    i_2._4_4_ = 0;
    val = 4.94065645841247e-324;
LAB_00109791:
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pl2_local->land,i);
    sVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(pvVar6);
    if (val != (double)(sVar7 - 1)) {
      do {
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pl2_local->land,i);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)val);
        dVar9 = pvVar8->first;
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&pPStack_18->land,i);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(long)i_2._4_4_);
        if (pvVar8->first <= dVar9) {
          pvVar6 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&pl2_local->land,i);
          pvVar8 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar6,(size_type)val);
          dVar9 = pvVar8->first;
          pvVar6 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&pPStack_18->land,i);
          pvVar8 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar6,(long)(i_2._4_4_ + 1));
          if (dVar9 <= pvVar8->first) goto LAB_0010987b;
        }
        i_2._4_4_ = i_2._4_4_ + 1;
      } while( true );
    }
    i = i + 1;
  } while( true );
LAB_0010987b:
  pvVar6 = std::
           vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ::operator[](&pPStack_18->land,i);
  pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[](pvVar6,(long)i_2._4_4_);
  p1.first = pvVar8->first;
  p1.second = pvVar8->second;
  pvVar6 = std::
           vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ::operator[](&pPStack_18->land,i);
  pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[](pvVar6,(long)(i_2._4_4_ + 1));
  p2.first = pvVar8->first;
  p2.second = pvVar8->second;
  pvVar6 = std::
           vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ::operator[](&pl2_local->land,i);
  pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[](pvVar6,(size_type)val);
  dVar9 = function_value(p1,p2,pvVar8->first);
  pvVar6 = std::
           vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ::operator[](&pl2_local->land,i);
  pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[](pvVar6,(size_type)val);
  dVar9 = ABS(dVar9 - pvVar8->second);
  if ((double)minimalNumberOfLevels <= dVar9) {
    minimalNumberOfLevels = (size_t)dVar9;
  }
  if ((maxDist._7_1_ & 1) != 0) {
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pl2_local->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(size_type)val);
    poVar4 = (ostream *)std::ostream::operator<<(&std::clog,pvVar8->first);
    poVar4 = std::operator<<(poVar4,"in [");
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pPStack_18->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(long)i_2._4_4_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
    poVar4 = std::operator<<(poVar4,",");
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pPStack_18->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(long)(i_2._4_4_ + 1));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
    std::operator<<(poVar4,"] \n");
    poVar4 = std::operator<<((ostream *)&std::clog,"pl1[level][i].second : ");
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pl2_local->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(size_type)val);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,pvVar8->second);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::clog,
                             "function_value( pl2[level][p2Count] , pl2[level][p2Count+1] , pl1[level][i].first ) : "
                            );
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pPStack_18->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(long)i_2._4_4_);
    p1_00.first = pvVar8->first;
    p1_00.second = pvVar8->second;
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pPStack_18->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(long)(i_2._4_4_ + 1));
    p2_00.first = pvVar8->first;
    p2_00.second = pvVar8->second;
    pvVar6 = std::
             vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ::operator[](&pl2_local->land,i);
    pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](pvVar6,(size_type)val);
    dVar10 = function_value(p1_00,p2_00,pvVar8->first);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar10);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::clog,"val : ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar9);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::istream::ignore();
  }
  val = (double)((long)val + 1);
  goto LAB_00109791;
}

Assistant:

double compute_maximal_distance_non_symmetric(const Persistence_landscape& pl1, const Persistence_landscape& pl2) {
  bool dbg = false;
  if (dbg) std::clog << " compute_maximal_distance_non_symmetric \n";
  // this distance is not symmetric. It compute ONLY distance between inflection points of pl1 and pl2.
  double maxDist = 0;
  size_t minimalNumberOfLevels = std::min(pl1.land.size(), pl2.land.size());
  for (size_t level = 0; level != minimalNumberOfLevels; ++level) {
    if (dbg) {
      std::clog << "Level : " << level << std::endl;
      std::clog << "PL1 : \n";
      for (size_t i = 0; i != pl1.land[level].size(); ++i) {
        std::clog << "(" << pl1.land[level][i].first << "," << pl1.land[level][i].second << ") \n";
      }
      std::clog << "PL2 : \n";
      for (size_t i = 0; i != pl2.land[level].size(); ++i) {
        std::clog << "(" << pl2.land[level][i].first << "," << pl2.land[level][i].second << ") \n";
      }
      std::cin.ignore();
    }

    int p2Count = 0;
    // In this case, I consider points at the infinity
    for (size_t i = 1; i != pl1.land[level].size() - 1; ++i) {
      while (true) {
        if ((pl1.land[level][i].first >= pl2.land[level][p2Count].first) &&
            (pl1.land[level][i].first <= pl2.land[level][p2Count + 1].first))
          break;
        p2Count++;
      }
      double val =
          fabs(function_value(pl2.land[level][p2Count], pl2.land[level][p2Count + 1], pl1.land[level][i].first) -
               pl1.land[level][i].second);
      if (maxDist <= val) maxDist = val;

      if (dbg) {
        std::clog << pl1.land[level][i].first << "in [" << pl2.land[level][p2Count].first << ","
                  << pl2.land[level][p2Count + 1].first << "] \n";
        std::clog << "pl1[level][i].second : " << pl1.land[level][i].second << std::endl;
        std::clog << "function_value( pl2[level][p2Count] , pl2[level][p2Count+1] , pl1[level][i].first ) : "
                  << function_value(pl2.land[level][p2Count], pl2.land[level][p2Count + 1], pl1.land[level][i].first)
                  << std::endl;
        std::clog << "val : " << val << std::endl;
        std::cin.ignore();
      }
    }
  }

  if (dbg) std::clog << "minimalNumberOfLevels : " << minimalNumberOfLevels << std::endl;

  if (minimalNumberOfLevels < pl1.land.size()) {
    for (size_t level = minimalNumberOfLevels; level != pl1.land.size(); ++level) {
      for (size_t i = 0; i != pl1.land[level].size(); ++i) {
        if (dbg) std::clog << "pl1[level][i].second  : " << pl1.land[level][i].second << std::endl;
        if (maxDist < pl1.land[level][i].second) maxDist = pl1.land[level][i].second;
      }
    }
  }
  return maxDist;
}